

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O3

void __thiscall HdmiCecAnalyzerResults::GenHeaderBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  byte bVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  DevAddress devAddress;
  string srcName;
  string dstName;
  string dstStr;
  string srcStr;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = (byte)((*(ulong *)(frame + 0x10) & 0xffffffff) >> 4) & 0xf;
  devAddress = (DevAddress)*(ulong *)(frame + 0x10) & DevAddress_UnregBcast;
  GetNumberString_abi_cxx11_(&local_70,this,(ulong)bVar1,4);
  GetNumberString_abi_cxx11_(&local_150,this,(ulong)devAddress,4);
  if (this->mTabular == false) {
    local_1b0 = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"H","");
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_1b0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    std::operator+(&local_170,"H ",&local_70);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_180 = *plVar4;
      lStack_178 = plVar2[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar4;
      local_190 = (long *)*plVar2;
    }
    local_188 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_1a0 = *plVar4;
      lStack_198 = plVar2[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *plVar4;
      local_1b0 = (long *)*plVar2;
    }
    local_1a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_1b0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    std::operator+(&local_170,"Header SRC=",&local_70);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_180 = *plVar4;
      lStack_178 = plVar2[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar4;
      local_190 = (long *)*plVar2;
    }
    local_188 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_1a0 = *plVar4;
      lStack_198 = plVar2[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *plVar4;
      local_1b0 = (long *)*plVar2;
    }
    local_1a8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    AnalyzerResults::AddResultString
              ((char *)this,(char *)local_1b0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  pcVar3 = HdmiCec::GetDevAddressString((uint)bVar1);
  std::__cxx11::string::string((string *)&local_1b0,pcVar3,(allocator *)&local_190);
  pcVar3 = HdmiCec::GetDevAddressString(devAddress);
  std::__cxx11::string::string((string *)&local_190,pcVar3,(allocator *)&local_170);
  std::operator+(&local_50,"Header SRC=",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
    local_f0 = (long *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_1b0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_130 = &local_120;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar2[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)local_150._M_dataplus._M_p);
  local_110 = &local_100;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_100 = *plVar4;
    lStack_f8 = plVar2[3];
  }
  else {
    local_100 = *plVar4;
    local_110 = (long *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_190);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_170.field_2._M_allocated_capacity = *psVar5;
    local_170.field_2._8_8_ = plVar2[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar5;
    local_170._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_170._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  AnalyzerResults::AddResultString
            ((char *)this,local_170._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenHeaderBubble( const Frame& frame )
{
    const U8 src = ( frame.mData1 >> 4 ) & 0xF;
    const U8 dst = ( frame.mData1 >> 0 ) & 0xF;
    std::string srcStr = GetNumberString( src, 4 );
    std::string dstStr = GetNumberString( dst, 4 );

    if( !mTabular )
    {
        AddResult( "H" );
        AddResult( "H " + srcStr + " to " + dstStr );
        AddResult( "Header SRC=" + srcStr + ", DST=" + dstStr );
    }

    std::string srcName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( src ) );
    std::string dstName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( dst ) );

    AddResult( "Header SRC=" + srcStr + " (" + srcName + "), DST=" + dstStr + " (" + dstName + ")" );
}